

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler_tests.cpp
# Opt level: O2

void __thiscall scheduler_tests::manythreads::test_method(manythreads *this)

{
  long lVar1;
  Function f_00;
  Function f_01;
  pointer ptVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  undefined8 uVar9;
  thread *thread;
  pointer ptVar10;
  time_point tVar11;
  FastRandomContext *pFVar12;
  iterator in_R8;
  iterator pvVar13;
  iterator in_R9;
  iterator pvVar14;
  long in_FS_OFFSET;
  bool bVar15;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  undefined4 uVar16;
  undefined4 uVar17;
  check_type cVar20;
  undefined8 in_stack_fffffffffffffad8;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffffae4;
  undefined4 uVar19;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  int counterSum;
  undefined1 local_498 [32];
  vector<std::thread,_std::allocator<std::thread>_> microThreads;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 local_3d0 [32];
  undefined1 local_3b0 [8];
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_3a8;
  CScheduler *local_3a0;
  _Head_base<2UL,_std::reference_wrapper<int>,_false> local_398;
  _Head_base<1UL,_std::reference_wrapper<std::mutex>,_false> local_390;
  _Head_base<0UL,_std::reference_wrapper<CScheduler>,_false> local_388;
  Function f;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  time_point last;
  time_point first;
  FastRandomContext rng;
  int counter [10];
  mutex counterMutex [10];
  CScheduler microTasks;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CScheduler::CScheduler(&microTasks);
  memset(counterMutex,0,400);
  counter[4] = 0;
  counter[5] = 0;
  counter[6] = 0;
  counter[7] = 0;
  counter[0] = 0;
  counter[1] = 0;
  counter[2] = 0;
  counter[3] = 0;
  counter[8] = 0;
  counter[9] = 0;
  FastRandomContext::FastRandomContext(&rng,true);
  lVar7 = std::chrono::_V2::steady_clock::now();
  first.__d.__r = (duration)0;
  last.__d.__r = (duration)0;
  sVar8 = CScheduler::getQueueInfo(&microTasks,&first,&last);
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x38;
  file.m_begin = (iterator)&local_340;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_350,msg);
  f.super__Function_base._M_functor._M_pod_data[0] = sVar8 == 0;
  f.super__Function_base._M_functor._8_8_ = 0;
  f.super__Function_base._M_manager = (_Manager_type)0x0;
  local_398._M_head_impl._M_data = (reference_wrapper<int>)&microThreads;
  microThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_e1b2fe;
  microThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xbc13cc;
  tVar11.__d.__r = (duration)local_3b0;
  local_3a8.__d.__r = (duration)((ulong)local_3a8.__d.__r & 0xffffffffffffff00);
  local_3b0 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_3a0 = (CScheduler *)boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_358 = "";
  uVar16 = 0;
  uVar17 = 0;
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&f,(lazy_ostream *)tVar11.__d.__r,1,0,WARN,_cVar20,
             (size_t)&local_360,0x38);
  boost::detail::shared_count::~shared_count((shared_count *)&f.super__Function_base._M_manager);
  iVar3 = 100;
  while (bVar15 = iVar3 != 0, iVar3 = iVar3 + -1, bVar15) {
    test_method::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&rng,(FastRandomContext *)tVar11.__d.__r);
    iVar4 = test_method::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&rng,(FastRandomContext *)tVar11.__d.__r);
    pFVar12 = (FastRandomContext *)0xa;
    iVar5 = RandomMixin<FastRandomContext>::randrange<int>
                      (&rng.super_RandomMixin<FastRandomContext>,10);
    iVar6 = test_method::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&rng,pFVar12);
    local_3b0 = (undefined1  [8])microTask;
    local_3a0 = (CScheduler *)CONCAT44(local_3a0._4_4_,iVar6);
    local_388._M_head_impl._M_data = (reference_wrapper<CScheduler>)&microTasks;
    local_3a8.__d.__r = (duration)(duration)((long)(iVar4 + 500) * 1000 + lVar7);
    local_398._M_head_impl._M_data =
         (reference_wrapper<int>)(reference_wrapper<int>)(counter + iVar5);
    local_390._M_head_impl._M_data =
         (reference_wrapper<std::mutex>)(reference_wrapper<std::mutex>)(counterMutex + iVar5);
    std::function<void()>::
    function<std::_Bind<void(*(std::reference_wrapper<CScheduler>,std::reference_wrapper<std::mutex>,std::reference_wrapper<int>,int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>))(CScheduler&,std::mutex&,int&,int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>)>,void>
              ((function<void()> *)&f,
               (_Bind<void_(*(std::reference_wrapper<CScheduler>,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>))(CScheduler_&,_std::mutex_&,_int_&,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)>
                *)local_3b0);
    std::function<void_()>::function((function<void_()> *)local_3d0,&f);
    f_00.super__Function_base._M_functor._4_4_ = uVar17;
    f_00.super__Function_base._M_functor._0_4_ = uVar16;
    f_00.super__Function_base._M_functor._8_8_ = (undefined8)_cVar20;
    f_00.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffad8;
    f_00._M_invoker._0_4_ = iVar3;
    f_00._M_invoker._4_4_ = in_stack_fffffffffffffae4;
    tVar11.__d.__r = (duration)(duration)local_3d0;
    CScheduler::schedule(&microTasks,f_00,(time_point)local_3d0);
    std::_Function_base::~_Function_base((_Function_base *)local_3d0);
    std::_Function_base::~_Function_base(&f.super__Function_base);
  }
  sVar8 = CScheduler::getQueueInfo(&microTasks,&first,&last);
  local_3e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar14;
  msg_00.m_begin = pvVar13;
  file_00.m_end = (iterator)0x44;
  file_00.m_begin = (iterator)&local_3e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3f0,
             msg_00);
  f.super__Function_base._M_functor._M_pod_data[0] = sVar8 == 100;
  f.super__Function_base._M_functor._8_8_ = 0;
  f.super__Function_base._M_manager = (_Manager_type)0x0;
  microThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_e1b309;
  microThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xbc13da;
  local_3a8.__d.__r = (duration)((ulong)local_3a8.__d.__r & 0xffffffffffffff00);
  local_3b0 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_3a0 = (CScheduler *)boost::unit_test::lazy_ostream::inst;
  local_398._M_head_impl._M_data = (reference_wrapper<int>)&microThreads;
  local_400 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_3f8 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&f,(lazy_ostream *)local_3b0,1,0,WARN,_cVar20,(size_t)&local_400,
             0x44);
  boost::detail::shared_count::~shared_count((shared_count *)&f.super__Function_base._M_manager);
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar14;
  msg_01.m_begin = pvVar13;
  file_01.m_end = (iterator)0x45;
  file_01.m_begin = (iterator)&local_410;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_420,
             msg_01);
  f.super__Function_base._M_functor._M_pod_data[0] = (long)first.__d.__r < (long)last.__d.__r;
  f.super__Function_base._M_functor._8_8_ = 0;
  f.super__Function_base._M_manager = (_Manager_type)0x0;
  microThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_e1b322;
  microThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xbc13e7;
  local_3a8.__d.__r = (duration)((ulong)local_3a8.__d.__r & 0xffffffffffffff00);
  local_3b0 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_3a0 = (CScheduler *)boost::unit_test::lazy_ostream::inst;
  local_398._M_head_impl._M_data = (reference_wrapper<int>)&microThreads;
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_428 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&f,(lazy_ostream *)local_3b0,1,0,WARN,_cVar20,(size_t)&local_430,
             0x45);
  boost::detail::shared_count::~shared_count((shared_count *)&f.super__Function_base._M_manager);
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar14;
  msg_02.m_begin = pvVar13;
  file_02.m_end = (iterator)0x46;
  file_02.m_begin = (iterator)&local_440;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_450,
             msg_02);
  f.super__Function_base._M_functor._M_pod_data[0] = lVar7 < (long)last.__d.__r;
  f.super__Function_base._M_functor._8_8_ = 0;
  f.super__Function_base._M_manager = (_Manager_type)0x0;
  microThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_e1b33b;
  microThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xbc13f2;
  local_3a8.__d.__r = (duration)((ulong)local_3a8.__d.__r & 0xffffffffffffff00);
  local_3b0 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_3a0 = (CScheduler *)boost::unit_test::lazy_ostream::inst;
  local_398._M_head_impl._M_data = (reference_wrapper<int>)&microThreads;
  local_460 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_458 = "";
  uVar16 = 0;
  uVar17 = 0;
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&f,(lazy_ostream *)local_3b0,1,0,WARN,_cVar20,(size_t)&local_460,
             0x46);
  boost::detail::shared_count::~shared_count((shared_count *)&f.super__Function_base._M_manager);
  microThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  microThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  microThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tVar11.__d.__r = (duration)10;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve(&microThreads,10);
  iVar3 = 5;
  while (bVar15 = iVar3 != 0, iVar3 = iVar3 + -1, bVar15) {
    local_3b0 = (undefined1  [8])CScheduler::serviceQueue;
    local_3a8.__d.__r = (duration)0;
    tVar11.__d.__r = (duration)(duration)local_3b0;
    local_3a0 = &microTasks;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<std::_Bind<void(CScheduler::*(CScheduler*))()>>
              ((vector<std::thread,std::allocator<std::thread>> *)&microThreads,
               (_Bind<void_(CScheduler::*(CScheduler_*))()> *)local_3b0);
  }
  local_3b0 = (undefined1  [8])0x258;
  UninterruptibleSleep((microseconds *)local_3b0);
  iVar3 = 5;
  uVar9 = std::chrono::_V2::steady_clock::now();
  uVar18 = (undefined4)uVar9;
  uVar19 = (undefined4)((ulong)uVar9 >> 0x20);
  while (bVar15 = iVar3 != 0, iVar3 = iVar3 + -1, bVar15) {
    local_3b0 = (undefined1  [8])CScheduler::serviceQueue;
    local_3a8.__d.__r = (duration)0;
    tVar11.__d.__r = (duration)(duration)local_3b0;
    local_3a0 = &microTasks;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<std::_Bind<void(CScheduler::*(CScheduler*))()>>
              ((vector<std::thread,std::allocator<std::thread>> *)&microThreads,
               (_Bind<void_(CScheduler::*(CScheduler_*))()> *)local_3b0);
  }
  iVar3 = 100;
  while (bVar15 = iVar3 != 0, iVar3 = iVar3 + -1, bVar15) {
    test_method::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&rng,(FastRandomContext *)tVar11.__d.__r);
    iVar4 = test_method::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&rng,(FastRandomContext *)tVar11.__d.__r);
    lVar7 = CONCAT44(uVar19,uVar18);
    pFVar12 = (FastRandomContext *)0xa;
    iVar5 = RandomMixin<FastRandomContext>::randrange<int>
                      (&rng.super_RandomMixin<FastRandomContext>,10);
    iVar6 = test_method::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&rng,pFVar12);
    local_3b0 = (undefined1  [8])microTask;
    local_3a0 = (CScheduler *)CONCAT44(local_3a0._4_4_,iVar6);
    local_3a8.__d.__r = (duration)(duration)((long)(iVar4 + 500) * 1000 + lVar7);
    local_398._M_head_impl._M_data =
         (reference_wrapper<int>)(reference_wrapper<int>)(counter + iVar5);
    local_390._M_head_impl._M_data =
         (reference_wrapper<std::mutex>)(reference_wrapper<std::mutex>)(counterMutex + iVar5);
    local_388._M_head_impl._M_data =
         (reference_wrapper<CScheduler>)(reference_wrapper<CScheduler>)&microTasks;
    std::function<void()>::
    function<std::_Bind<void(*(std::reference_wrapper<CScheduler>,std::reference_wrapper<std::mutex>,std::reference_wrapper<int>,int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>))(CScheduler&,std::mutex&,int&,int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>)>,void>
              ((function<void()> *)&f,
               (_Bind<void_(*(std::reference_wrapper<CScheduler>,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>))(CScheduler_&,_std::mutex_&,_int_&,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)>
                *)local_3b0);
    std::function<void_()>::function((function<void_()> *)local_498,&f);
    f_01.super__Function_base._M_functor._4_4_ = uVar17;
    f_01.super__Function_base._M_functor._0_4_ = uVar16;
    f_01.super__Function_base._M_functor._8_8_ = (undefined8)_cVar20;
    f_01.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffad8;
    f_01._M_invoker._0_4_ = uVar18;
    f_01._M_invoker._4_4_ = uVar19;
    tVar11.__d.__r = (duration)(duration)local_498;
    CScheduler::schedule(&microTasks,f_01,(time_point)local_498);
    std::_Function_base::~_Function_base((_Function_base *)local_498);
    std::_Function_base::~_Function_base(&f.super__Function_base);
  }
  CScheduler::StopWhenDrained(&microTasks);
  ptVar2 = microThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar10 = microThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start; ptVar10 != ptVar2; ptVar10 = ptVar10 + 1) {
    if ((ptVar10->_M_id)._M_thread != 0) {
      std::thread::join();
    }
  }
  counterSum = 0;
  for (lVar7 = 0; iVar3 = counterSum, lVar7 != 10; lVar7 = lVar7 + 1) {
    local_4b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
    ;
    local_4a8 = "";
    local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_03.m_end = pvVar14;
    msg_03.m_begin = pvVar13;
    file_03.m_end = (iterator)0x67;
    file_03.m_begin = (iterator)&local_4b0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_4c0,
               msg_03);
    f.super__Function_base._M_functor._M_pod_data[0] = counter[lVar7] != 0;
    f.super__Function_base._M_functor._8_8_ = 0;
    f.super__Function_base._M_manager = (_Manager_type)0x0;
    local_4d0 = "counter[i] != 0";
    local_4c8 = "";
    local_3a8.__d.__r = (duration)((ulong)local_3a8.__d.__r & 0xffffffffffffff00);
    local_3b0 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
    local_3a0 = (CScheduler *)boost::unit_test::lazy_ostream::inst;
    local_398._M_head_impl._M_data = (reference_wrapper<int>)&local_4d0;
    local_4e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
    ;
    local_4d8 = "";
    pvVar13 = &DAT_00000001;
    pvVar14 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&f,(lazy_ostream *)local_3b0,1,0,WARN,_cVar20,(size_t)&local_4e0,
               0x67);
    boost::detail::shared_count::~shared_count((shared_count *)&f.super__Function_base._M_manager);
    counterSum = iVar3 + counter[lVar7];
  }
  local_4f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar14;
  msg_04.m_begin = pvVar13;
  file_04.m_end = (iterator)0x6a;
  file_04.m_begin = (iterator)&local_4f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_500,
             msg_04);
  local_3a8.__d.__r = (duration)((ulong)local_3a8.__d.__r & 0xffffffffffffff00);
  local_3b0 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_3a0 = (CScheduler *)boost::unit_test::lazy_ostream::inst;
  local_398._M_head_impl._M_data = (reference_wrapper<int>)((long)"\x05\x04\x03\x02\x01" + 5);
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_508 = "";
  f.super__Function_base._M_functor._0_4_ = 200;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_3b0,&local_510,0x6a,1,2,&counterSum,0xbc1403,&f,"200");
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&microThreads);
  ChaCha20::~ChaCha20(&rng.rng);
  CScheduler::~CScheduler(&microTasks);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(manythreads)
{
    // Stress test: hundreds of microsecond-scheduled tasks,
    // serviced by 10 threads.
    //
    // So... ten shared counters, which if all the tasks execute
    // properly will sum to the number of tasks done.
    // Each task adds or subtracts a random amount from one of the
    // counters, and then schedules another task 0-1000
    // microseconds in the future to subtract or add from
    // the counter -random_amount+1, so in the end the shared
    // counters should sum to the number of initial tasks performed.
    CScheduler microTasks;

    std::mutex counterMutex[10];
    int counter[10] = { 0 };
    FastRandomContext rng{/*fDeterministic=*/true};
    auto zeroToNine = [](FastRandomContext& rc) -> int { return rc.randrange(10); }; // [0, 9]
    auto randomMsec = [](FastRandomContext& rc) -> int { return -11 + (int)rc.randrange(1012); }; // [-11, 1000]
    auto randomDelta = [](FastRandomContext& rc) -> int { return -1000 + (int)rc.randrange(2001); }; // [-1000, 1000]

    auto start = std::chrono::steady_clock::now();
    auto now = start;
    std::chrono::steady_clock::time_point first, last;
    size_t nTasks = microTasks.getQueueInfo(first, last);
    BOOST_CHECK(nTasks == 0);

    for (int i = 0; i < 100; ++i) {
        auto t = now + std::chrono::microseconds(randomMsec(rng));
        auto tReschedule = now + std::chrono::microseconds(500 + randomMsec(rng));
        int whichCounter = zeroToNine(rng);
        CScheduler::Function f = std::bind(&microTask, std::ref(microTasks),
                                             std::ref(counterMutex[whichCounter]), std::ref(counter[whichCounter]),
                                             randomDelta(rng), tReschedule);
        microTasks.schedule(f, t);
    }
    nTasks = microTasks.getQueueInfo(first, last);
    BOOST_CHECK(nTasks == 100);
    BOOST_CHECK(first < last);
    BOOST_CHECK(last > now);

    // As soon as these are created they will start running and servicing the queue
    std::vector<std::thread> microThreads;
    microThreads.reserve(10);
    for (int i = 0; i < 5; i++)
        microThreads.emplace_back(std::bind(&CScheduler::serviceQueue, &microTasks));

    UninterruptibleSleep(std::chrono::microseconds{600});
    now = std::chrono::steady_clock::now();

    // More threads and more tasks:
    for (int i = 0; i < 5; i++)
        microThreads.emplace_back(std::bind(&CScheduler::serviceQueue, &microTasks));
    for (int i = 0; i < 100; i++) {
        auto t = now + std::chrono::microseconds(randomMsec(rng));
        auto tReschedule = now + std::chrono::microseconds(500 + randomMsec(rng));
        int whichCounter = zeroToNine(rng);
        CScheduler::Function f = std::bind(&microTask, std::ref(microTasks),
                                             std::ref(counterMutex[whichCounter]), std::ref(counter[whichCounter]),
                                             randomDelta(rng), tReschedule);
        microTasks.schedule(f, t);
    }

    // Drain the task queue then exit threads
    microTasks.StopWhenDrained();
    // wait until all the threads are done
    for (auto& thread: microThreads) {
        if (thread.joinable()) thread.join();
    }

    int counterSum = 0;
    for (int i = 0; i < 10; i++) {
        BOOST_CHECK(counter[i] != 0);
        counterSum += counter[i];
    }
    BOOST_CHECK_EQUAL(counterSum, 200);
}